

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_mutex_failed(MDB_env *env,mdb_mutexref_t mutex,int rc)

{
  uint rlocked_00;
  MDB_meta *pMVar1;
  MDB_meta *meta;
  int rc2;
  int rlocked;
  int rc_local;
  mdb_mutexref_t mutex_local;
  MDB_env *env_local;
  
  rc2 = rc;
  if (rc == 0x82) {
    rc2 = 0;
    rlocked_00 = (uint)(mutex == (mdb_mutexref_t)((long)&env->me_txns->mt1 + 8));
    if (rlocked_00 == 0) {
      pMVar1 = mdb_env_pick_meta(env);
      (env->me_txns->mt1).mtb.mtb_txnid = pMVar1->mm_txnid;
      if (env->me_txn != (MDB_txn *)0x0) {
        env->me_flags = env->me_flags | 0x80000000;
        env->me_txn = (MDB_txn *)0x0;
        rc2 = -0x784b;
      }
    }
    meta._4_4_ = mdb_reader_check0(env,rlocked_00,(int *)0x0);
    if (meta._4_4_ == 0) {
      meta._4_4_ = pthread_mutex_consistent((pthread_mutex_t *)mutex);
    }
    if ((rc2 != 0) || (rc2 = meta._4_4_, meta._4_4_ != 0)) {
      pthread_mutex_unlock((pthread_mutex_t *)mutex);
    }
  }
  return rc2;
}

Assistant:

static int ESECT
mdb_mutex_failed(MDB_env *env, mdb_mutexref_t mutex, int rc)
{
	int rlocked, rc2;
	MDB_meta *meta;

	if (rc == MDB_OWNERDEAD) {
		/* We own the mutex. Clean up after dead previous owner. */
		rc = MDB_SUCCESS;
		rlocked = (mutex == env->me_rmutex);
		if (!rlocked) {
			/* Keep mti_txnid updated, otherwise next writer can
			 * overwrite data which latest meta page refers to.
			 */
			meta = mdb_env_pick_meta(env);
			env->me_txns->mti_txnid = meta->mm_txnid;
			/* env is hosed if the dead thread was ours */
			if (env->me_txn) {
				env->me_flags |= MDB_FATAL_ERROR;
				env->me_txn = NULL;
				rc = MDB_PANIC;
			}
		}
		DPRINTF(("%cmutex owner died, %s", (rlocked ? 'r' : 'w'),
			(rc ? "this process' env is hosed" : "recovering")));
		rc2 = mdb_reader_check0(env, rlocked, NULL);
		if (rc2 == 0)
			rc2 = mdb_mutex_consistent(mutex);
		if (rc || (rc = rc2)) {
			DPRINTF(("LOCK_MUTEX recovery failed, %s", mdb_strerror(rc)));
			UNLOCK_MUTEX(mutex);
		}
	} else {
#ifdef _WIN32
		rc = ErrCode();
#endif
		DPRINTF(("LOCK_MUTEX failed, %s", mdb_strerror(rc)));
	}

	return rc;
}